

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderPointsgl_PointSize::deinit(TessellationShaderPointsgl_PointSize *this)

{
  pointer p_Var1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  _test_descriptor *test;
  pointer p_Var5;
  long lVar4;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) != 0) {
      (**(code **)(lVar4 + 0x4e8))(0x8642);
    }
    (**(code **)(lVar4 + 0x1680))(0);
    (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    (**(code **)(lVar4 + 0xd8))(0);
    for (p_Var5 = (this->m_tests).
                  super__Vector_base<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor,_std::allocator<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        p_Var5 != (this->m_tests).
                  super__Vector_base<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor,_std::allocator<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_finish; p_Var5 = p_Var5 + 1) {
      if (p_Var5->fs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
      }
      if (p_Var5->gs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
      }
      if (p_Var5->po_id != 0) {
        (**(code **)(lVar4 + 0x448))();
      }
      if (p_Var5->tes_id != 0) {
        (**(code **)(lVar4 + 0x470))();
      }
      if (p_Var5->tcs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
      }
      if (p_Var5->vs_id != 0) {
        (**(code **)(lVar4 + 0x470))();
      }
    }
    p_Var1 = (this->m_tests).
             super__Vector_base<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor,_std::allocator<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var5 != p_Var1) {
      (this->m_tests).
      super__Vector_base<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor,_std::allocator<glcts::TessellationShaderPointsgl_PointSize::_test_descriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish = p_Var1;
    }
    if (this->m_fbo_id != 0) {
      (**(code **)(lVar4 + 0x440))(1,&this->m_fbo_id);
      this->m_fbo_id = 0;
    }
    if (this->m_to_id != 0) {
      (**(code **)(lVar4 + 0x480))(1,&this->m_to_id);
      this->m_to_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TessellationShaderPointsgl_PointSize::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Disable point size */
		gl.disable(GL_PROGRAM_POINT_SIZE);
	}

	/* Reset the program object */
	gl.useProgram(0);

	/* Revert GL_PATCH_VERTICES_EXT to default value */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Deinitialize test-specific objects */
	for (_tests_iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		const _test_descriptor& test = *it;

		if (test.fs_id != 0)
		{
			gl.deleteShader(test.fs_id);
		}

		if (test.gs_id != 0)
		{
			gl.deleteShader(test.gs_id);
		}

		if (test.po_id != 0)
		{
			gl.deleteProgram(test.po_id);
		}

		if (test.tes_id != 0)
		{
			gl.deleteShader(test.tes_id);
		}

		if (test.tcs_id != 0)
		{
			gl.deleteShader(test.tcs_id);
		}

		if (test.vs_id != 0)
		{
			gl.deleteShader(test.vs_id);
		}
	}
	m_tests.clear();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}